

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall Diligent::ThreadPoolImpl::ReprioritizeAllTasks(ThreadPoolImpl *this)

{
  bool bVar1;
  pointer ppVar2;
  IAsyncTask *pIVar3;
  reference __args;
  float extraout_XMM0_Da;
  pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo> *it_1;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  *__range2;
  float local_3c;
  QueuedTaskInfo *pQStack_38;
  float Priority;
  QueuedTaskInfo *TaskInfo;
  _Self local_28;
  iterator it;
  unique_lock<std::mutex> lock;
  ThreadPoolImpl *this_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it,&this->m_TasksQueueMtx);
  std::
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::clear(&this->m_ReprioritizationList);
  local_28._M_node =
       (_Base_ptr)
       std::
       multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
       ::begin(&this->m_TasksQueue);
  while( true ) {
    TaskInfo = (QueuedTaskInfo *)
               std::
               multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
               ::end(&this->m_TasksQueue);
    bVar1 = std::operator!=(&local_28,(_Self *)&TaskInfo);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>::
             operator->(&local_28);
    pQStack_38 = &ppVar2->second;
    pIVar3 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->(&pQStack_38->pTask);
    (*(pIVar3->super_IObject)._vptr_IObject[9])();
    local_3c = extraout_XMM0_Da;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>::
             operator->(&local_28);
    if ((ppVar2->first != local_3c) || (NAN(ppVar2->first) || NAN(local_3c))) {
      std::
      vector<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::allocator<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
      ::emplace_back<float&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                ((vector<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::allocator<std::pair<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                  *)&this->m_ReprioritizationList,&local_3c,pQStack_38);
      local_28._M_node =
           (_Base_ptr)
           std::
           multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
           ::erase_abi_cxx11_((multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                               *)&this->m_TasksQueue,local_28._M_node);
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>::
      operator++(&local_28);
    }
  }
  __end2 = std::
           vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
           ::begin(&this->m_ReprioritizationList);
  it_1 = (pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo> *)
         std::
         vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
         ::end(&this->m_ReprioritizationList);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_*,_std::vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>_>
                                     *)&it_1), bVar1) {
    __args = __gnu_cxx::
             __normal_iterator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_*,_std::vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>_>
             ::operator*(&__end2);
    std::
    multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
    ::emplace<float&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
              ((multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                *)&this->m_TasksQueue,&__args->first,&__args->second);
    __gnu_cxx::
    __normal_iterator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_*,_std::vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::clear(&this->m_ReprioritizationList);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  return;
}

Assistant:

ReprioritizeAllTasks() override final
    {
        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

        m_ReprioritizationList.clear();
        for (auto it = m_TasksQueue.begin(); it != m_TasksQueue.end();)
        {
            auto& TaskInfo = it->second;
            auto  Priority = TaskInfo.pTask->GetPriority();
            if (it->first != Priority)
            {
                m_ReprioritizationList.emplace_back(Priority, std::move(TaskInfo));
                it = m_TasksQueue.erase(it);
            }
            else
            {
                ++it;
            }
        }

        for (auto& it : m_ReprioritizationList)
        {
            m_TasksQueue.emplace(it.first, std::move(it.second));
        }

        m_ReprioritizationList.clear();
    }